

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O2

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurementNoiseCovariance
          (ModelBaseEKFFlexEstimatorIMU *this,Matrix *R)

{
  if (((int)(R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
       == 6) &&
     ((int)(R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
      6)) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&this->R_,R);
    (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
      _vptr_FlexibilityEstimatorBase[0x44])(this);
    return;
  }
  __assert_fail("unsigned(R.rows())==6 && unsigned(R.cols())==6 && \"ERROR: The measurement noise covariance matrix R has                         incorrect size\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/model-base-ekf-flex-estimator-imu.cpp"
                ,0xca,
                "virtual void stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurementNoiseCovariance(const Matrix &)"
               );
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setMeasurementNoiseCovariance
                                            (const Matrix & R)
    {
        BOOST_ASSERT(unsigned(R.rows())==6 &&
                     unsigned(R.cols())==6 &&
                    "ERROR: The measurement noise covariance matrix R has \
                        incorrect size");

        R_=R;
        updateMeasurementCovarianceMatrix_();
    }